

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckd_alloc.c
# Opt level: O0

jmp_buf * ckd_set_jump(jmp_buf *env,int abort)

{
  jmp_buf *pa_Var1;
  jmp_buf *old;
  int abort_local;
  jmp_buf *env_local;
  
  pa_Var1 = ckd_target;
  if (abort != 0) {
    jmp_abort = 1;
  }
  ckd_target = env;
  return pa_Var1;
}

Assistant:

jmp_buf *
ckd_set_jump(jmp_buf *env, int abort)
{
    jmp_buf *old;

    if (abort)
        jmp_abort = 1;

    old = ckd_target;
    ckd_target = env;
    return old;
}